

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImGuiKeyRoutingData * ImGui::GetShortcutRoutingData(ImGuiKeyChord key_chord)

{
  ImVector<ImGuiKeyRoutingData> *pIVar1;
  int iVar2;
  int iVar3;
  ImGuiKeyRoutingIndex *pIVar4;
  ImGuiContext *pIVar5;
  ImGuiKeyRoutingData *pIVar6;
  ImGuiKeyRoutingData *pIVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  short sVar13;
  int iVar14;
  ImGuiKeyRoutingData *pIVar15;
  
  pIVar5 = GImGui;
  uVar11 = key_chord & 0xf000;
  uVar8 = key_chord & 0xffff0fffU;
  if ((((key_chord & 0xffff0fffU) == 0) && (uVar8 = uVar11, key_chord - 0x1000U < 0x8000)) &&
     (uVar12 = key_chord - 0x1000U >> 0xc, (0x8bU >> (uVar12 & 0x1f) & 1) != 0)) {
    uVar8 = *(uint *)(&DAT_001f98e0 + (ulong)uVar12 * 4);
  }
  pIVar15 = (ImGuiKeyRoutingData *)
            ((long)&GImGui->KeysOwnerData[0x45].OwnerCurr + (long)(int)uVar8 * 2);
  pIVar7 = pIVar15;
  do {
    pIVar4 = &pIVar7->NextEntryIndex;
    lVar10 = (long)*pIVar4;
    if (lVar10 == -1) break;
    pIVar6 = (GImGui->KeysRoutingTable).Entries.Data;
    pIVar7 = pIVar6 + lVar10;
  } while (uVar11 != pIVar6[lVar10].Mods);
  if (*pIVar4 == -1) {
    iVar2 = (GImGui->KeysRoutingTable).Entries.Size;
    iVar3 = (GImGui->KeysRoutingTable).Entries.Capacity;
    if (iVar2 == iVar3) {
      if (iVar3 == 0) {
        iVar9 = 8;
      }
      else {
        iVar9 = iVar3 / 2 + iVar3;
      }
      iVar14 = iVar2 + 1;
      if (iVar2 + 1 < iVar9) {
        iVar14 = iVar9;
      }
      if (iVar3 < iVar14) {
        pIVar6 = (ImGuiKeyRoutingData *)MemAlloc((long)iVar14 << 4);
        pIVar7 = (pIVar5->KeysRoutingTable).Entries.Data;
        if (pIVar7 != (ImGuiKeyRoutingData *)0x0) {
          memcpy(pIVar6,pIVar7,(long)(pIVar5->KeysRoutingTable).Entries.Size << 4);
          MemFree((pIVar5->KeysRoutingTable).Entries.Data);
        }
        (pIVar5->KeysRoutingTable).Entries.Data = pIVar6;
        (pIVar5->KeysRoutingTable).Entries.Capacity = iVar14;
      }
    }
    pIVar7 = (pIVar5->KeysRoutingTable).Entries.Data;
    iVar3 = (pIVar5->KeysRoutingTable).Entries.Size;
    pIVar7[iVar3].NextEntryIndex = -1;
    pIVar7[iVar3].Mods = 0;
    pIVar7[iVar3].RoutingCurrScore = 0xff;
    pIVar7[iVar3].RoutingNextScore = 0xff;
    pIVar7[iVar3].RoutingCurr = 0xffffffff;
    pIVar7[iVar3].RoutingNext = 0xffffffff;
    pIVar1 = &(pIVar5->KeysRoutingTable).Entries;
    pIVar1->Size = pIVar1->Size + 1;
    pIVar6 = (pIVar5->KeysRoutingTable).Entries.Data;
    sVar13 = (short)iVar2;
    pIVar7 = pIVar6 + sVar13;
    pIVar6[sVar13].Mods = (ImU16)uVar11;
    pIVar6[sVar13].NextEntryIndex = pIVar15->NextEntryIndex;
    pIVar15->NextEntryIndex = sVar13;
  }
  return pIVar7;
}

Assistant:

ImGuiKeyRoutingData* ImGui::GetShortcutRoutingData(ImGuiKeyChord key_chord)
{
    // Majority of shortcuts will be Key + any number of Mods
    // We accept _Single_ mod with ImGuiKey_None.
    //  - Shortcut(ImGuiKey_S | ImGuiMod_Ctrl);                    // Legal
    //  - Shortcut(ImGuiKey_S | ImGuiMod_Ctrl | ImGuiMod_Shift);   // Legal
    //  - Shortcut(ImGuiMod_Ctrl);                                 // Legal
    //  - Shortcut(ImGuiMod_Ctrl | ImGuiMod_Shift);                // Not legal
    ImGuiContext& g = *GImGui;
    ImGuiKeyRoutingTable* rt = &g.KeysRoutingTable;
    ImGuiKeyRoutingData* routing_data;
    ImGuiKey key = (ImGuiKey)(key_chord & ~ImGuiMod_Mask_);
    ImGuiKey mods = (ImGuiKey)(key_chord & ImGuiMod_Mask_);
    if (key == ImGuiKey_None)
        key = ConvertSingleModFlagToKey(mods);
    IM_ASSERT(IsNamedKey(key));

    // Get (in the majority of case, the linked list will have one element so this should be 2 reads.
    // Subsequent elements will be contiguous in memory as list is sorted/rebuilt in NewFrame).
    for (ImGuiKeyRoutingIndex idx = rt->Index[key - ImGuiKey_NamedKey_BEGIN]; idx != -1; idx = routing_data->NextEntryIndex)
    {
        routing_data = &rt->Entries[idx];
        if (routing_data->Mods == mods)
            return routing_data;
    }

    // Add to linked-list
    ImGuiKeyRoutingIndex routing_data_idx = (ImGuiKeyRoutingIndex)rt->Entries.Size;
    rt->Entries.push_back(ImGuiKeyRoutingData());
    routing_data = &rt->Entries[routing_data_idx];
    routing_data->Mods = (ImU16)mods;
    routing_data->NextEntryIndex = rt->Index[key - ImGuiKey_NamedKey_BEGIN]; // Setup linked list
    rt->Index[key - ImGuiKey_NamedKey_BEGIN] = routing_data_idx;
    return routing_data;
}